

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-path.c
# Opt level: O1

void plutovg_path_traverse_flatten
               (plutovg_path_t *path,plutovg_path_traverse_func_t traverse_func,void *closure)

{
  plutovg_path_command_t pVar1;
  plutovg_path_element_t *ppVar2;
  undefined1 *puVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  float fVar7;
  int iVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  plutovg_point_t points [3];
  plutovg_point_t p;
  bezier_t beziers [32];
  undefined1 auStack_468 [12];
  int local_45c;
  anon_struct_8_2_c2b912b6_for_header local_458;
  plutovg_path_element_t local_450;
  anon_struct_8_2_c2b912b6_for_header aStack_448;
  plutovg_point_t local_440;
  float local_438;
  int local_434;
  anon_struct_8_2_c2b912b6_for_header local_430;
  plutovg_path_element_t local_428;
  anon_struct_8_2_c2b912b6_for_header aStack_420;
  float afStack_418 [250];
  
  if (path->num_curves == 0) {
    plutovg_path_traverse(path,traverse_func,closure);
    return;
  }
  iVar5 = (path->elements).size;
  if (0 < iVar5) {
    ppVar2 = (path->elements).data;
    iVar6 = 0;
    fVar7 = 0.0;
    iVar8 = 0;
    local_45c = iVar5;
    do {
      lVar4 = (long)iVar6;
      pVar1 = ppVar2[lVar4].header.command;
      if (pVar1 < PLUTOVG_PATH_COMMAND_CUBIC_TO) {
LAB_00112001:
        local_458 = ppVar2[lVar4 + 1].header;
      }
      else if (pVar1 == PLUTOVG_PATH_COMMAND_CUBIC_TO) {
        local_458 = ppVar2[lVar4 + 1].header;
        local_450 = ppVar2[lVar4 + 2];
        aStack_448 = ppVar2[lVar4 + 3].header;
      }
      else if (pVar1 == PLUTOVG_PATH_COMMAND_CLOSE) goto LAB_00112001;
      iVar6 = *(int *)((long)ppVar2 + lVar4 * 8 + 4) + iVar6;
      pVar1 = ppVar2[lVar4].header.command;
      if (pVar1 < PLUTOVG_PATH_COMMAND_CUBIC_TO) {
LAB_00112048:
        (*traverse_func)(closure,pVar1,(plutovg_point_t *)&local_458,1);
        fVar7 = (float)local_458.command;
        iVar8 = local_458.length;
      }
      else if (pVar1 == PLUTOVG_PATH_COMMAND_CUBIC_TO) {
        local_438 = fVar7;
        local_434 = iVar8;
        local_430 = local_458;
        local_428 = local_450;
        aStack_420 = aStack_448;
        lVar4 = 0;
        puVar3 = auStack_468;
        do {
          fVar7 = *(float *)(puVar3 + 0x4c);
          fVar10 = *(float *)(puVar3 + 0x34);
          fVar9 = *(float *)(puVar3 + 0x48);
          fVar12 = fVar7 - fVar10;
          fVar13 = *(float *)((long)&local_438 + lVar4);
          fVar14 = fVar9 - fVar13;
          if (ABS(fVar12) + ABS(fVar14) <= 1.0) {
            fVar11 = ABS(fVar10 - *(float *)(puVar3 + 0x44)) +
                     ABS(fVar13 - *(float *)(puVar3 + 0x40)) +
                     ABS(fVar10 - *(float *)(puVar3 + 0x3c)) +
                     ABS(fVar13 - *(float *)(puVar3 + 0x38));
            fVar12 = 0.25;
          }
          else {
            fVar11 = ABS((fVar10 - *(float *)(puVar3 + 0x44)) * fVar14 -
                         (fVar13 - *(float *)(puVar3 + 0x40)) * fVar12) +
                     ABS((fVar10 - *(float *)(puVar3 + 0x3c)) * fVar14 -
                         (fVar13 - *(float *)(puVar3 + 0x38)) * fVar12);
            fVar12 = (ABS(fVar12) + ABS(fVar14)) * 0.25;
          }
          if ((lVar4 == 0x3e0) || (fVar11 < fVar12)) {
            local_440.x = fVar9;
            local_440.y = fVar7;
            (*traverse_func)(closure,PLUTOVG_PATH_COMMAND_LINE_TO,&local_440,1);
            lVar4 = lVar4 + -0x20;
          }
          else {
            fVar12 = *(float *)(puVar3 + 0x40);
            fVar14 = (*(float *)(puVar3 + 0x38) + fVar12) * 0.5;
            fVar11 = (fVar13 + *(float *)(puVar3 + 0x38)) * 0.5;
            *(float *)((long)afStack_418 + lVar4 + 8) = fVar11;
            fVar9 = (fVar9 + fVar12) * 0.5;
            *(float *)(puVar3 + 0x40) = fVar9;
            *(float *)((long)afStack_418 + lVar4) = fVar13;
            fVar13 = (fVar11 + fVar14) * 0.5;
            *(float *)((long)afStack_418 + lVar4 + 0x10) = fVar13;
            fVar9 = (fVar9 + fVar14) * 0.5;
            *(float *)(puVar3 + 0x38) = fVar9;
            fVar9 = (fVar9 + fVar13) * 0.5;
            *(float *)((long)&local_438 + lVar4) = fVar9;
            *(float *)((long)afStack_418 + lVar4 + 0x18) = fVar9;
            fVar9 = *(float *)(puVar3 + 0x44);
            fVar13 = (*(float *)(puVar3 + 0x3c) + fVar9) * 0.5;
            fVar12 = (fVar10 + *(float *)(puVar3 + 0x3c)) * 0.5;
            *(float *)((long)afStack_418 + lVar4 + 0xc) = fVar12;
            fVar7 = (fVar7 + fVar9) * 0.5;
            *(float *)(puVar3 + 0x44) = fVar7;
            *(float *)((long)afStack_418 + lVar4 + 4) = fVar10;
            fVar10 = (fVar12 + fVar13) * 0.5;
            *(float *)((long)afStack_418 + lVar4 + 0x14) = fVar10;
            fVar7 = (fVar7 + fVar13) * 0.5;
            *(float *)(puVar3 + 0x3c) = fVar7;
            fVar7 = (fVar7 + fVar10) * 0.5;
            *(float *)(puVar3 + 0x34) = fVar7;
            *(float *)((long)afStack_418 + lVar4 + 0x1c) = fVar7;
            lVar4 = lVar4 + 0x20;
          }
          puVar3 = auStack_468 + lVar4;
        } while (-1 < lVar4);
        fVar7 = (float)aStack_448.command;
        iVar8 = aStack_448.length;
        iVar5 = local_45c;
      }
      else if (pVar1 == PLUTOVG_PATH_COMMAND_CLOSE) goto LAB_00112048;
    } while (iVar6 < iVar5);
  }
  return;
}

Assistant:

void plutovg_path_traverse_flatten(const plutovg_path_t* path, plutovg_path_traverse_func_t traverse_func, void* closure)
{
    if(path->num_curves == 0) {
        plutovg_path_traverse(path, traverse_func, closure);
        return;
    }

    const float threshold = 0.25f;

    plutovg_path_iterator_t it;
    plutovg_path_iterator_init(&it, path);

    bezier_t beziers[32];
    plutovg_point_t points[3];
    plutovg_point_t current_point = {0, 0};
    while(plutovg_path_iterator_has_next(&it)) {
        plutovg_path_command_t command = plutovg_path_iterator_next(&it, points);
        switch(command) {
        case PLUTOVG_PATH_COMMAND_MOVE_TO:
        case PLUTOVG_PATH_COMMAND_LINE_TO:
        case PLUTOVG_PATH_COMMAND_CLOSE:
            traverse_func(closure, command, points, 1);
            current_point = points[0];
            break;
        case PLUTOVG_PATH_COMMAND_CUBIC_TO:
            beziers[0].x1 = current_point.x;
            beziers[0].y1 = current_point.y;
            beziers[0].x2 = points[0].x;
            beziers[0].y2 = points[0].y;
            beziers[0].x3 = points[1].x;
            beziers[0].y3 = points[1].y;
            beziers[0].x4 = points[2].x;
            beziers[0].y4 = points[2].y;
            bezier_t* b = beziers;
            while(b >= beziers) {
                float y4y1 = b->y4 - b->y1;
                float x4x1 = b->x4 - b->x1;
                float l = fabsf(x4x1) + fabsf(y4y1);
                float d;
                if(l > 1.f) {
                    d = fabsf((x4x1)*(b->y1 - b->y2) - (y4y1)*(b->x1 - b->x2)) + fabsf((x4x1)*(b->y1 - b->y3) - (y4y1)*(b->x1 - b->x3));
                } else {
                    d = fabsf(b->x1 - b->x2) + fabsf(b->y1 - b->y2) + fabsf(b->x1 - b->x3) + fabsf(b->y1 - b->y3);
                    l = 1.f;
                }

                if(d < threshold*l || b == beziers + 31) {
                    plutovg_point_t p = { b->x4, b->y4 };
                    traverse_func(closure, PLUTOVG_PATH_COMMAND_LINE_TO, &p, 1);
                    --b;
                } else {
                    split_bezier(b, b + 1, b);
                    ++b;
                }
            }

            current_point = points[2];
            break;
        }
    }
}